

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O2

void ImNodes::EndSlot(void)

{
  Pair **ppPVar1;
  float val;
  int iVar2;
  ImGuiStorage *this;
  ImGuiWindow *window;
  ImGuiStorage *pIVar3;
  Pair *pPVar4;
  Pair *pPVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  Pair **ppPVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  ImGuiID IVar13;
  ImU32 IVar14;
  ImGuiPayload *pIVar15;
  ImGuiStorage *pIVar16;
  Pair **ppPVar17;
  ImRect *pIVar18;
  float local_88;
  float fStack_84;
  char drag_id [32];
  ImRect slot_rect;
  ImVec2 local_40;
  undefined8 local_38;
  ulong local_30;
  
  ImGui::GetStyle();
  lVar11 = gCanvas;
  this = *(ImGuiStorage **)(gCanvas + 0x98);
  ImGui::EndGroup();
  ppPVar8 = (Pair **)(this + 3);
  ImGui::PushID(*(char **)&this[3].Data);
  ImGui::PushID(*(int *)&this[2].Data.Data);
  IVar6 = ImGui::GetItemRectMin();
  IVar7 = ImGui::GetItemRectMax();
  local_88 = IVar6.x;
  fStack_84 = IVar6.y;
  slot_rect.Max.x = IVar7.x;
  slot_rect.Max.y = IVar7.y;
  slot_rect.Min.x = local_88;
  slot_rect.Min.y = fStack_84;
  IVar13 = ImGui::GetID(*(char **)&this[3].Data);
  ImGui::ItemAdd(&slot_rect,IVar13,(ImRect *)0x0);
  bVar12 = ImGui::IsMouseClicked(0,false);
  if ((bVar12) && (bVar12 = ImGui::IsItemHovered(0), bVar12)) {
    IVar13 = ImGui::GetID((char *)*ppPVar8);
    window = GImGui->CurrentWindow;
    window->WriteAccessed = true;
    ImGui::SetActiveID(IVar13,window);
  }
  bVar12 = ImGui::IsItemActive();
  if ((bVar12) && (bVar12 = ImGui::IsMouseDown(0), !bVar12)) {
    ImGui::ClearActiveID();
  }
  iVar2 = *(int *)&this[2].Data.Data;
  pIVar18 = &slot_rect;
  if (-1 < iVar2) {
    pIVar18 = (ImRect *)&slot_rect.Max;
  }
  val = (pIVar18->Min).x;
  IVar14 = MakeSlotDataID("x",*(char **)&this[3].Data,*(void **)&this[1].Data,
                          SUB41((uint)iVar2 >> 0x1f,0));
  ImGuiStorage::SetFloat(this,IVar14,val);
  IVar14 = MakeSlotDataID("y",*(char **)&this[3].Data,*(void **)&this[1].Data,
                          SUB41((uint)*(undefined4 *)&this[2].Data.Data >> 0x1f,0));
  ImGuiStorage::SetFloat(this,IVar14,(slot_rect.Max.y - slot_rect.Min.y) * -0.5 + slot_rect.Max.y);
  bVar12 = ImGui::BeginDragDropSource(0);
  if (bVar12) {
    pIVar15 = ImGui::GetDragDropPayload();
    snprintf(drag_id,0x20,"new-node-connection-%08X");
    if ((pIVar15 == (ImGuiPayload *)0x0) ||
       (bVar12 = ImGuiPayload::IsDataType(pIVar15,drag_id), !bVar12)) {
      local_40 = *(ImVec2 *)(this + 1);
      local_30 = (ulong)*(uint *)&this[2].Data.Data;
      local_38._0_4_ = this[3].Data.Size;
      local_38._4_4_ = this[3].Data.Capacity;
      ImGui::SetDragDropPayload(drag_id,&local_40,0x18,0);
      this[4].Data.Size = 0;
      this[4].Data.Capacity = 0;
      this[4].Data.Data = (Pair *)0x0;
      this[5].Data.Size = 0;
      this[5].Data.Capacity = 0;
      this[5].Data.Data = (Pair *)0x0;
      ImVector<ImNodes::_IgnoreSlot>::clear
                ((ImVector<ImNodes::_IgnoreSlot> *)(*(long *)(lVar11 + 0x98) + 0x98));
    }
    ImGui::TextUnformatted((char *)*ppPVar8,(char *)0x0);
    ImGui::EndDragDropSource();
  }
  bVar12 = IsConnectingCompatibleSlot();
  if ((bVar12) && (bVar12 = ImGui::BeginDragDropTarget(), bVar12)) {
    snprintf(drag_id,0x20,"new-node-connection-%08X",(ulong)(uint)-*(int *)&this[2].Data.Data);
    pIVar15 = ImGui::AcceptDragDropPayload(drag_id,0);
    if (pIVar15 != (ImGuiPayload *)0x0) {
      bVar12 = *(int *)&this[2].Data.Data < 0;
      pIVar3 = (ImGuiStorage *)pIVar15->Data;
      pIVar16 = pIVar3;
      if (bVar12) {
        pIVar16 = this + 1;
      }
      ppPVar1 = &(pIVar3->Data).Data;
      ppPVar17 = ppPVar1;
      if (!bVar12) {
        ppPVar17 = ppPVar8;
        ppPVar8 = ppPVar1;
        pIVar3 = this + 1;
      }
      pPVar4 = *ppPVar17;
      iVar9 = (pIVar3->Data).Size;
      iVar10 = (pIVar3->Data).Capacity;
      pPVar5 = *ppPVar8;
      iVar2 = (pIVar16->Data).Capacity;
      this[4].Data.Size = (pIVar16->Data).Size;
      this[4].Data.Capacity = iVar2;
      this[4].Data.Data = pPVar5;
      this[5].Data.Size = iVar9;
      this[5].Data.Capacity = iVar10;
      this[5].Data.Data = pPVar4;
      *(undefined1 *)&this[8].Data.Data = 1;
      ImVector<ImNodes::_IgnoreSlot>::clear
                ((ImVector<ImNodes::_IgnoreSlot> *)(*(long *)(lVar11 + 0x98) + 0x98));
    }
    ImGui::EndDragDropTarget();
  }
  ImGui::PopID();
  ImGui::PopID();
  return;
}

Assistant:

void EndSlot()
{
    const ImGuiStyle& style = ImGui::GetStyle();
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    ImGui::EndGroup();

    ImGui::PushID(impl->slot.title);
    ImGui::PushID(impl->slot.kind);

    ImRect slot_rect{ImGui::GetItemRectMin(), ImGui::GetItemRectMax()};
    // This here adds extra line between slots because after user renders slot cursor is already past those items.
    // ImGui::ItemSize(slot_rect.GetSize());
    ImGui::ItemAdd(slot_rect, ImGui::GetID(impl->slot.title));

    if (ImGui::IsMouseClicked(0) && ImGui::IsItemHovered())
        ImGui::SetActiveID(ImGui::GetID(impl->slot.title), ImGui::GetCurrentWindow());

    if (ImGui::IsItemActive() && !ImGui::IsMouseDown(0))
        ImGui::ClearActiveID();

    // Store slot edge positions, curves will connect there
    {
        float x;
        if (IsInputSlotKind(impl->slot.kind))
            x = slot_rect.Min.x;
        else
            x = slot_rect.Max.x;

        impl->cached_data.SetFloat(MakeSlotDataID("x", impl->slot.title, impl->node.id, IsInputSlotKind(impl->slot.kind)), x);
        impl->cached_data.SetFloat(MakeSlotDataID("y", impl->slot.title, impl->node.id, IsInputSlotKind(impl->slot.kind)),
            slot_rect.Max.y - slot_rect.GetHeight() / 2);
    }

    if (ImGui::BeginDragDropSource())
    {
        auto* payload = ImGui::GetDragDropPayload();
        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind);
        if (payload == nullptr || !payload->IsDataType(drag_id))
        {
            _DragConnectionPayload drag_data{ };
            drag_data.node_id = impl->node.id;
            drag_data.slot_kind = impl->slot.kind;
            drag_data.slot_title = impl->slot.title;

            ImGui::SetDragDropPayload(drag_id, &drag_data, sizeof(drag_data));

            // Clear new connection info
            impl->new_connection.input_node = nullptr;
            impl->new_connection.input_slot = nullptr;
            impl->new_connection.output_node = nullptr;
            impl->new_connection.output_slot = nullptr;
            canvas->_impl->ignore_connections.clear();
        }
        ImGui::TextUnformatted(impl->slot.title);
        ImGui::EndDragDropSource();
    }

    if (IsConnectingCompatibleSlot() && ImGui::BeginDragDropTarget())
    {
        // Accept drags from opposite type (input <-> output, and same kind)
        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind * -1);

        if (auto* payload = ImGui::AcceptDragDropPayload(drag_id))
        {
            auto* drag_data = (_DragConnectionPayload*) payload->Data;

            // Store info of source slot to be queried by ImNodes::GetConnection()
            if (!IsInputSlotKind(impl->slot.kind))
            {
                impl->new_connection.input_node = drag_data->node_id;
                impl->new_connection.input_slot = drag_data->slot_title;
                impl->new_connection.output_node = impl->node.id;
                impl->new_connection.output_slot = impl->slot.title;
            }
            else
            {
                impl->new_connection.input_node = impl->node.id;
                impl->new_connection.input_slot = impl->slot.title;
                impl->new_connection.output_node = drag_data->node_id;
                impl->new_connection.output_slot = drag_data->slot_title;
            }
            impl->just_connected = true;
            canvas->_impl->ignore_connections.clear();
        }

        ImGui::EndDragDropTarget();
    }

    ImGui::PopID(); // kind
    ImGui::PopID(); // name
}